

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::VertexAttributeIntegerCase::test
          (VertexAttributeIntegerCase *this)

{
  CallLogWrapper *this_00;
  uint stride;
  TestLog *pTVar1;
  GLenum GVar2;
  ulong in_R8;
  long lVar3;
  allocator<char> local_162;
  allocator<char> local_161;
  ScopedLogSection section;
  GLfloat vertexData [4];
  GLint aGStack_148 [3];
  byte abStack_13c [4];
  PointerData pointers [11];
  
  pTVar1 = (this->super_ApiCase).m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)pointers,"DefaultVAO",&local_161);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)vertexData,"Test with default VAO",&local_162);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)pointers,(string *)vertexData);
  std::__cxx11::string::~string((string *)vertexData);
  std::__cxx11::string::~string((string *)pointers);
  pointers[0].size = 1;
  pointers[0].type = 0x1400;
  pointers[0].stride = 0;
  pointers[0].normalized = '\0';
  pointers[0].pointer = (string *)vertexData;
  pointers[1].size = 1;
  pointers[1].type = 0x1402;
  pointers[1].stride = 0;
  pointers[1].normalized = '\0';
  pointers[1].pointer = (string *)vertexData;
  pointers[2].size = 1;
  pointers[2].type = 0x1404;
  pointers[2].stride = 0;
  pointers[2].normalized = '\0';
  pointers[2].pointer = (string *)vertexData;
  pointers[3].size = 1;
  pointers[3].type = 0x140c;
  pointers[3].stride = 0;
  pointers[3].normalized = '\0';
  pointers[3].pointer = (string *)vertexData;
  pointers[4].size = 1;
  pointers[4].type = 0x1406;
  pointers[4].stride = 0;
  pointers[4].normalized = '\0';
  pointers[4].pointer = (string *)vertexData;
  pointers[5].size = 1;
  pointers[5].type = 0x140b;
  pointers[5].stride = 0;
  pointers[5].normalized = '\0';
  pointers[5].pointer = (string *)vertexData;
  pointers[6].size = 1;
  pointers[6].type = 0x1401;
  pointers[6].stride = 0;
  pointers[6].normalized = '\0';
  pointers[6].pointer = (string *)vertexData;
  pointers[7].size = 1;
  pointers[7].type = 0x1403;
  pointers[7].stride = 0;
  pointers[7].normalized = '\0';
  pointers[7].pointer = (string *)vertexData;
  pointers[8].size = 1;
  pointers[8].type = 0x1405;
  pointers[8].stride = 0;
  pointers[8].normalized = '\0';
  pointers[8].pointer = (string *)vertexData;
  pointers[9].size = 4;
  pointers[9].type = 0x8d9f;
  pointers[9].stride = 0;
  vertexData[0] = 0.0;
  vertexData[1] = 0.0;
  vertexData[2] = 0.0;
  vertexData[3] = 0.0;
  pointers[9].normalized = '\0';
  pointers[9].pointer = (string *)vertexData;
  pointers[10].size = 4;
  pointers[10].type = 0x8368;
  pointers[10].stride = 0;
  pointers[10].normalized = '\0';
  pointers[10].pointer = (string *)vertexData;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  for (lVar3 = 0x10; lVar3 != 0x118; lVar3 = lVar3 + 0x18) {
    in_R8 = (ulong)abStack_13c[lVar3];
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,0,*(GLint *)((long)aGStack_148 + lVar3),
               *(GLenum *)((long)aGStack_148 + lVar3 + 4),abStack_13c[lVar3],
               *(GLsizei *)((long)aGStack_148 + lVar3 + 8),
               *(void **)((long)&pointers[0].size + lVar3));
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       this_00,0x88fd,0,(GLenum)in_R8);
  }
  pointers[0].size = 1;
  pointers[0].type = 0x1400;
  pointers[0].stride = 0;
  pointers[0].pointer = (string *)vertexData;
  pointers[1].size = 1;
  pointers[1].type = 0x1402;
  pointers[1].stride = 0;
  pointers[1].pointer = (string *)vertexData;
  pointers[2].size = 1;
  pointers[2].type = 0x1404;
  pointers[2].stride = 0;
  pointers[2].pointer = (string *)vertexData;
  pointers[3].size = 1;
  pointers[3].type = 0x1401;
  pointers[3].stride = 0;
  pointers[3].pointer = (string *)vertexData;
  pointers[4].size = 1;
  pointers[4].type = 0x1403;
  pointers[4].stride = 0;
  pointers[4].pointer = (string *)vertexData;
  pointers[5].size = 1;
  pointers[5].type = 0x1405;
  pointers[5].stride = 0;
  pointers[5].pointer = (string *)vertexData;
  for (lVar3 = 0x10; GVar2 = (GLenum)in_R8, lVar3 != 0xa0; lVar3 = lVar3 + 0x18) {
    stride = *(uint *)((long)aGStack_148 + lVar3 + 8);
    in_R8 = (ulong)stride;
    glu::CallLogWrapper::glVertexAttribIPointer
              (this_00,0,*(GLint *)((long)aGStack_148 + lVar3),
               *(GLenum *)((long)aGStack_148 + lVar3 + 4),stride,
               *(void **)((long)&pointers[0].size + lVar3));
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       this_00,0x88fd,1,(GLenum)in_R8);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = (this->super_ApiCase).m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)pointers,"WithVAO",&local_161);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)vertexData,"Test with VAO",&local_162);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)pointers,(string *)vertexData);
  std::__cxx11::string::~string((string *)vertexData);
  std::__cxx11::string::~string((string *)pointers);
  vertexData._0_8_ = vertexData._0_8_ & 0xffffffff00000000;
  pointers[0].size = 0;
  pointers[0].type = 0;
  glu::CallLogWrapper::glGenVertexArrays(this_00,2,(GLuint *)pointers);
  glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)vertexData);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,(GLuint)vertexData[0]);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,pointers[0].size);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x88fd,0,GVar2);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glVertexAttribIPointer(this_00,0,1,0x1404,0,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,pointers[0].type);
  GVar2 = 0;
  glu::CallLogWrapper::glVertexAttribPointer(this_00,0,1,0x1406,'\0',0,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x88fd,0,GVar2);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,pointers[0].size);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x88fd,1,GVar2);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,2,(GLuint *)pointers);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)vertexData);
  ApiCase::expectError(&this->super_ApiCase,0);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  return;
}

Assistant:

void test (void)
	{
		// Test with default VAO
		{
			const tcu::ScopedLogSection section(m_log, "DefaultVAO", "Test with default VAO");

			const GLfloat vertexData[4] = {0.0f}; // never accessed

			// test VertexAttribPointer
			{
				const PointerData pointers[] =
				{
					{ 1, GL_BYTE,								0,	GL_FALSE, vertexData	},
					{ 1, GL_SHORT,								0,	GL_FALSE, vertexData	},
					{ 1, GL_INT,								0,	GL_FALSE, vertexData	},
					{ 1, GL_FIXED,								0,	GL_FALSE, vertexData	},
					{ 1, GL_FLOAT,								0,	GL_FALSE, vertexData	},
					{ 1, GL_HALF_FLOAT,							0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_BYTE,						0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_SHORT,						0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_INT,						0,	GL_FALSE, vertexData	},
					{ 4, GL_INT_2_10_10_10_REV,					0,	GL_FALSE, vertexData	},
					{ 4, GL_UNSIGNED_INT_2_10_10_10_REV,		0,	GL_FALSE, vertexData	},
				};

				for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
				{
					glVertexAttribPointer(0, pointers[ndx].size, pointers[ndx].type, pointers[ndx].normalized, pointers[ndx].stride, pointers[ndx].pointer);
					expectError(GL_NO_ERROR);

					verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_INTEGER, GL_FALSE);
				}
			}

			// test glVertexAttribIPointer
			{
				const PointerData pointers[] =
				{
					{ 1, GL_BYTE,								0,	GL_FALSE, vertexData	},
					{ 1, GL_SHORT,								0,	GL_FALSE, vertexData	},
					{ 1, GL_INT,								0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_BYTE,						0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_SHORT,						0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_INT,						0,	GL_FALSE, vertexData	},
				};

				for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
				{
					glVertexAttribIPointer(0, pointers[ndx].size, pointers[ndx].type, pointers[ndx].stride, pointers[ndx].pointer);
					expectError(GL_NO_ERROR);

					verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_INTEGER, GL_TRUE);
				}
			}
		}

		// Test with multiple VAOs
		{
			const tcu::ScopedLogSection section(m_log, "WithVAO", "Test with VAO");

			GLuint buf		= 0;
			GLuint vaos[2]	= {0};

			glGenVertexArrays(2, vaos);
			glGenBuffers(1, &buf);
			glBindBuffer(GL_ARRAY_BUFFER, buf);
			expectError(GL_NO_ERROR);

			// initial
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_INTEGER, GL_FALSE);
			expectError(GL_NO_ERROR);

			// set vao 0 to some value
			glVertexAttribIPointer(0, 1, GL_INT, 0, DE_NULL);
			expectError(GL_NO_ERROR);

			// set vao 1 to some other value
			glBindVertexArray(vaos[1]);
			glVertexAttribPointer(0, 1, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			expectError(GL_NO_ERROR);

			// verify vao 1 state
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_INTEGER, GL_FALSE);
			expectError(GL_NO_ERROR);

			// verify vao 0 state
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_INTEGER, GL_TRUE);
			expectError(GL_NO_ERROR);

			glDeleteVertexArrays(2, vaos);
			glDeleteBuffers(1, &buf);
			expectError(GL_NO_ERROR);
		}
	}